

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::write_ktx(mipmapped_texture *this,data_stream_serializer *serializer)

{
  bool bVar1;
  pixel_format pVar2;
  texture_type tVar3;
  uint uVar4;
  uint uVar5;
  orientation_flags_t oVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  mip_level *this_00;
  dxt_image *this_01;
  element *pImage;
  color_quad<unsigned_char,_int> *color;
  uchar *pImage_00;
  undefined8 uVar10;
  uint local_168;
  uint local_164;
  uint x;
  uint y;
  uint8 *pDst;
  vector<unsigned_char> tmp;
  image_u8 *p_1;
  dxt_image *p;
  uint mip_height;
  uint mip_width;
  mip_level *pLevel;
  uint level_index;
  uint face_index;
  dynamic_string ktx_orient_str;
  mip_level *pLevel0;
  dynamic_string fourcc_str;
  bool local_e1;
  undefined1 local_e0 [7];
  bool success;
  ktx_texture kt;
  pixel_packer packer;
  uint32 ogl_type;
  uint32 ogl_fmt;
  uint32 ogl_internal_fmt;
  data_stream_serializer *serializer_local;
  mipmapped_texture *this_local;
  
  if (this->m_width == 0) {
    set_last_error(this,"Nothing to write");
    return false;
  }
  set_last_error(this,"write_ktx() failed");
  packer.m_rgb_is_luma = false;
  packer._57_3_ = 0;
  packer.m_comp_max[3] = 0;
  pixel_packer::pixel_packer((pixel_packer *)&kt.m_opposite_endianness);
  bVar1 = is_packed(this);
  if (!bVar1) {
    packer.m_comp_max[3] = 0x1401;
    pVar2 = get_format(this);
    if (pVar2 == PIXEL_FMT_A8R8G8B8) {
      ogl_type = 0x8058;
      packer.m_rgb_is_luma = true;
      packer._57_3_ = 0x19;
      pixel_packer::init((pixel_packer *)&kt.m_opposite_endianness,(EVP_PKEY_CTX *)"R8G8B8A8");
    }
    else if (pVar2 == PIXEL_FMT_A8L8) {
      ogl_type = 0x8045;
      packer.m_rgb_is_luma = true;
      packer._57_3_ = 0x19;
      pixel_packer::init((pixel_packer *)&kt.m_opposite_endianness,(EVP_PKEY_CTX *)"Y8A8");
    }
    else if (pVar2 == PIXEL_FMT_A8) {
      ogl_type = 0x803c;
      packer.m_rgb_is_luma = true;
      packer._57_3_ = 0x19;
      pixel_packer::init((pixel_packer *)&kt.m_opposite_endianness,(EVP_PKEY_CTX *)0x22b3ad);
    }
    else if (pVar2 == PIXEL_FMT_R8G8B8) {
      ogl_type = 0x8051;
      packer.m_rgb_is_luma = true;
      packer._57_3_ = 0x19;
      pixel_packer::init((pixel_packer *)&kt.m_opposite_endianness,(EVP_PKEY_CTX *)0x22bab0);
    }
    else {
      if (pVar2 != PIXEL_FMT_L8) {
        return false;
      }
      ogl_type = 0x8040;
      packer.m_rgb_is_luma = true;
      packer._57_3_ = 0x19;
      pixel_packer::init((pixel_packer *)&kt.m_opposite_endianness,(EVP_PKEY_CTX *)"G8");
    }
    goto LAB_0014c42a;
  }
  pVar2 = get_format(this);
  if (pVar2 == PIXEL_FMT_ETC1) {
LAB_0014c2c5:
    ogl_type = 0x8d64;
    goto LAB_0014c42a;
  }
  if (pVar2 == PIXEL_FMT_DXT5A) {
    ogl_type = 0x8c70;
    goto LAB_0014c42a;
  }
  if (pVar2 == PIXEL_FMT_DXT1) {
    ogl_type = 0x83f0;
    goto LAB_0014c42a;
  }
  if (pVar2 == PIXEL_FMT_ETC2) {
    ogl_type = 0x9274;
    goto LAB_0014c42a;
  }
  if (pVar2 == PIXEL_FMT_3DC) {
LAB_0014c2b3:
    ogl_type = 0x8dbe;
    goto LAB_0014c42a;
  }
  if ((pVar2 == PIXEL_FMT_DXT2) || (pVar2 == PIXEL_FMT_DXT3)) {
    ogl_type = 0x83f2;
    goto LAB_0014c42a;
  }
  if ((pVar2 != PIXEL_FMT_DXT4) && (pVar2 != PIXEL_FMT_DXT5)) {
    if (pVar2 == PIXEL_FMT_DXT1A) {
      ogl_type = 0x83f1;
      goto LAB_0014c42a;
    }
    if (pVar2 == PIXEL_FMT_ETC2A) {
LAB_0014c2d7:
      ogl_type = 0x9278;
      goto LAB_0014c42a;
    }
    if (((pVar2 != PIXEL_FMT_DXT5_AGBR) && (pVar2 != PIXEL_FMT_DXT5_xGBR)) &&
       (pVar2 != PIXEL_FMT_DXT5_xGxR)) {
      if (pVar2 == PIXEL_FMT_ETC1S) goto LAB_0014c2c5;
      if (pVar2 == PIXEL_FMT_ETC2AS) goto LAB_0014c2d7;
      if (pVar2 == PIXEL_FMT_DXN) goto LAB_0014c2b3;
      if (pVar2 != PIXEL_FMT_DXT5_CCxY) {
        return false;
      }
    }
  }
  ogl_type = 0x83f3;
LAB_0014c42a:
  ktx_texture::ktx_texture((ktx_texture *)local_e0);
  tVar3 = determine_texture_type(this);
  if (tVar3 == cTextureTypeCubemap) {
    uVar4 = get_width(this);
    uVar5 = get_num_levels(this);
    local_e1 = ktx_texture::init_cubemap
                         ((ktx_texture *)local_e0,uVar4,uVar5,ogl_type,packer._56_4_,
                          packer.m_comp_max[3]);
  }
  else {
    uVar4 = get_width(this);
    uVar5 = get_height(this);
    uVar8 = get_num_levels(this);
    local_e1 = ktx_texture::init_2D
                         ((ktx_texture *)local_e0,uVar4,uVar5,uVar8,ogl_type,packer._56_4_,
                          packer.m_comp_max[3]);
  }
  if (local_e1 == false) {
    this_local._7_1_ = false;
    fourcc_str.m_pStr._0_4_ = 1;
  }
  else {
    pVar2 = this->m_format;
    dynamic_string::dynamic_string
              ((dynamic_string *)&pLevel0,cVarArg,"%c%c%c%c",(ulong)(byte)pVar2,
               (ulong)(byte)(pVar2 >> 8),(ulong)(pVar2 >> 0x10 & 0xff),pVar2 >> 0x18);
    pcVar9 = dynamic_string::get_ptr((dynamic_string *)&pLevel0);
    ktx_texture::add_key_value((ktx_texture *)local_e0,"CRNLIB_FOURCC",pcVar9);
    ktx_orient_str.m_pStr = (char *)get_level(this,0,0);
    oVar6 = mip_level::get_orientation_flags((mip_level *)ktx_orient_str.m_pStr);
    uVar7 = 0x72;
    if ((oVar6 & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
      uVar7 = 0x6c;
    }
    oVar6 = mip_level::get_orientation_flags((mip_level *)ktx_orient_str.m_pStr);
    uVar10 = 100;
    if ((oVar6 & cOrientationFlagYFlipped) != cDefaultOrientationFlags) {
      uVar10 = 0x75;
    }
    dynamic_string::dynamic_string
              ((dynamic_string *)&level_index,cVarArg,"S=%c,T=%c",(ulong)uVar7,uVar10);
    pcVar9 = dynamic_string::get_ptr((dynamic_string *)&level_index);
    ktx_texture::add_key_value((ktx_texture *)local_e0,"KTXorientation",pcVar9);
    for (pLevel._4_4_ = 0; uVar4 = get_num_faces(this), pLevel._4_4_ < uVar4;
        pLevel._4_4_ = pLevel._4_4_ + 1) {
      for (pLevel._0_4_ = 0; uVar4 = get_num_levels(this), (uint)pLevel < uVar4;
          pLevel._0_4_ = (uint)pLevel + 1) {
        this_00 = get_level(this,pLevel._4_4_,(uint)pLevel);
        uVar4 = mip_level::get_width(this_00);
        uVar5 = mip_level::get_height(this_00);
        bVar1 = is_packed(this);
        if (bVar1) {
          this_01 = mip_level::get_dxt_image(this_00);
          pImage = dxt_image::get_element_ptr(this_01);
          uVar4 = dxt_image::get_size_in_bytes(this_01);
          ktx_texture::add_image((ktx_texture *)local_e0,pLevel._4_4_,(uint)pLevel,pImage,uVar4);
        }
        else {
          tmp._8_8_ = mip_level::get_image(this_00);
          uVar8 = pixel_packer::get_pixel_stride((pixel_packer *)&kt.m_opposite_endianness);
          vector<unsigned_char>::vector((vector<unsigned_char> *)&pDst,uVar4 * uVar5 * uVar8);
          _x = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)&pDst);
          for (local_164 = 0; local_164 < uVar5; local_164 = local_164 + 1) {
            for (local_168 = 0; local_168 < uVar4; local_168 = local_168 + 1) {
              color = image<crnlib::color_quad<unsigned_char,_int>_>::get_unclamped
                                ((image<crnlib::color_quad<unsigned_char,_int>_> *)tmp._8_8_,
                                 local_168,local_164);
              _x = (uchar *)pixel_packer::pack<crnlib::color_quad<unsigned_char,int>>
                                      ((pixel_packer *)&kt.m_opposite_endianness,color,_x,true);
            }
          }
          pImage_00 = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)&pDst);
          uVar4 = vector<unsigned_char>::size_in_bytes((vector<unsigned_char> *)&pDst);
          ktx_texture::add_image((ktx_texture *)local_e0,pLevel._4_4_,(uint)pLevel,pImage_00,uVar4);
          vector<unsigned_char>::~vector((vector<unsigned_char> *)&pDst);
        }
      }
    }
    this_local._7_1_ = ktx_texture::write_to_stream((ktx_texture *)local_e0,serializer,false);
    if (this_local._7_1_) {
      clear_last_error(this);
    }
    fourcc_str.m_pStr._0_4_ = 1;
    dynamic_string::~dynamic_string((dynamic_string *)&level_index);
    dynamic_string::~dynamic_string((dynamic_string *)&pLevel0);
  }
  ktx_texture::~ktx_texture((ktx_texture *)local_e0);
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::write_ktx(data_stream_serializer& serializer) const {
  if (!m_width) {
    set_last_error("Nothing to write");
    return false;
  }

  set_last_error("write_ktx() failed");

  uint32 ogl_internal_fmt = 0, ogl_fmt = 0, ogl_type = 0;

  pixel_packer packer;

  if (is_packed()) {
    switch (get_format()) {
      case PIXEL_FMT_DXT1: {
        ogl_internal_fmt = KTX_COMPRESSED_RGB_S3TC_DXT1_EXT;
        break;
      }
      case PIXEL_FMT_DXT1A: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT;
        break;
      }
      case PIXEL_FMT_DXT2:
      case PIXEL_FMT_DXT3: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT;
        break;
      }
      case PIXEL_FMT_DXT4:
      case PIXEL_FMT_DXT5:
      case PIXEL_FMT_DXT5_CCxY:
      case PIXEL_FMT_DXT5_xGxR:
      case PIXEL_FMT_DXT5_xGBR:
      case PIXEL_FMT_DXT5_AGBR: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT;
        break;
      }
      case PIXEL_FMT_3DC:
      case PIXEL_FMT_DXN: {
        ogl_internal_fmt = KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT;
        break;
      }
      case PIXEL_FMT_DXT5A: {
        ogl_internal_fmt = KTX_COMPRESSED_LUMINANCE_LATC1_EXT;
        break;
      }
      case PIXEL_FMT_ETC1:
      case PIXEL_FMT_ETC1S: {
        ogl_internal_fmt = KTX_ETC1_RGB8_OES;
        break;
      }
      case PIXEL_FMT_ETC2: {
        ogl_internal_fmt = KTX_COMPRESSED_RGB8_ETC2;
        break;
      }
      case PIXEL_FMT_ETC2A:
      case PIXEL_FMT_ETC2AS: {
        ogl_internal_fmt = KTX_COMPRESSED_RGBA8_ETC2_EAC;
        break;
      }
      default: {
        CRNLIB_ASSERT(0);
        return false;
      }
    }
  } else {
    ogl_type = KTX_UNSIGNED_BYTE;

    switch (get_format()) {
      case PIXEL_FMT_R8G8B8:
        ogl_internal_fmt = KTX_RGB8;
        ogl_fmt = KTX_RGB;
        packer.init("R8G8B8");
        break;
      case PIXEL_FMT_L8:
        ogl_internal_fmt = KTX_LUMINANCE8;
        ogl_fmt = KTX_LUMINANCE;
        packer.init("G8");
        break;
      case PIXEL_FMT_A8:
        ogl_internal_fmt = KTX_ALPHA8;
        ogl_fmt = KTX_ALPHA;
        packer.init("A8");
        break;
      case PIXEL_FMT_A8L8:
        ogl_internal_fmt = KTX_LUMINANCE8_ALPHA8;
        ogl_fmt = KTX_LUMINANCE_ALPHA;
        packer.init("Y8A8");
        break;
      case PIXEL_FMT_A8R8G8B8:
        ogl_internal_fmt = KTX_RGBA8;
        ogl_fmt = KTX_RGBA;
        packer.init("R8G8B8A8");
        break;
      default: {
        CRNLIB_ASSERT(0);
        return false;
      }
    }
  }

  ktx_texture kt;
  bool success;
  if (determine_texture_type() == cTextureTypeCubemap)
    success = kt.init_cubemap(get_width(), get_num_levels(), ogl_internal_fmt, ogl_fmt, ogl_type);
  else
    success = kt.init_2D(get_width(), get_height(), get_num_levels(), ogl_internal_fmt, ogl_fmt, ogl_type);
  if (!success)
    return false;

  dynamic_string fourcc_str(cVarArg, "%c%c%c%c", m_format & 0xFF, (m_format >> 8) & 0xFF, (m_format >> 16) & 0xFF, (m_format >> 24) & 0xFF);
  kt.add_key_value("CRNLIB_FOURCC", fourcc_str.get_ptr());

  const mip_level* pLevel0 = get_level(0, 0);
  dynamic_string ktx_orient_str(cVarArg, "S=%c,T=%c", (pLevel0->get_orientation_flags() & cOrientationFlagXFlipped) ? 'l' : 'r', (pLevel0->get_orientation_flags() & cOrientationFlagYFlipped) ? 'u' : 'd');
  kt.add_key_value("KTXorientation", ktx_orient_str.get_ptr());

  for (uint face_index = 0; face_index < get_num_faces(); face_index++) {
    for (uint level_index = 0; level_index < get_num_levels(); level_index++) {
      const mip_level* pLevel = get_level(face_index, level_index);

      const uint mip_width = pLevel->get_width();
      const uint mip_height = pLevel->get_height();

      if (is_packed()) {
        const dxt_image* p = pLevel->get_dxt_image();

        kt.add_image(face_index, level_index, p->get_element_ptr(), p->get_size_in_bytes());
      } else {
        const image_u8* p = pLevel->get_image();

        crnlib::vector<uint8> tmp(mip_width * mip_height * packer.get_pixel_stride());

        uint8* pDst = tmp.get_ptr();
        for (uint y = 0; y < mip_height; y++)
          for (uint x = 0; x < mip_width; x++)
            pDst = (uint8*)packer.pack(p->get_unclamped(x, y), pDst);

        kt.add_image(face_index, level_index, tmp.get_ptr(), tmp.size_in_bytes());
      }
    }
  }

  if (!kt.write_to_stream(serializer))
    return false;

  clear_last_error();
  return true;
}